

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int reparse_relative_location_path(lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t uVar1;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  lyxp_token *plVar5;
  lyxp_token tok;
  
  uVar2 = *exp_idx;
  if (exp->used != uVar2) {
    plVar5 = exp->tokens;
    do {
      tok = plVar5[uVar2];
      switch(tok) {
      case LYXP_TOKEN_DOT:
      case LYXP_TOKEN_DDOT:
        uVar2 = uVar2 + 1;
        *exp_idx = uVar2;
        goto LAB_00167eb2;
      case LYXP_TOKEN_AT:
        uVar2 = uVar2 + 1;
        *exp_idx = uVar2;
        if (exp->used == uVar2) goto LAB_00167e6c;
        tok = plVar5[uVar2];
        if (1 < tok - LYXP_TOKEN_NAMETEST) goto switchD_00167eaa_caseD_8;
        break;
      default:
switchD_00167eaa_caseD_8:
        pcVar4 = print_token(tok);
        ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar4,exp->expr + exp->expr_pos[*exp_idx])
        ;
        return -1;
      case LYXP_TOKEN_NAMETEST:
        break;
      case LYXP_TOKEN_NODETYPE:
        *exp_idx = uVar2 + 1;
        iVar3 = exp_check_token(exp,uVar2 + 1,LYXP_TOKEN_PAR1,1);
        if (iVar3 != 0) {
          return -1;
        }
        uVar1 = *exp_idx;
        *exp_idx = uVar1 + 1;
        iVar3 = exp_check_token(exp,uVar1 + 1,LYXP_TOKEN_PAR2,1);
        if (iVar3 != 0) {
          return -1;
        }
        uVar2 = *exp_idx;
      }
      *exp_idx = uVar2 + 1;
      while ((uVar2 = *exp_idx, uVar2 < exp->used && (exp->tokens[uVar2] == LYXP_TOKEN_BRACK1))) {
        iVar3 = reparse_predicate(exp,exp_idx);
        if (iVar3 != 0) {
          return -1;
        }
      }
LAB_00167eb2:
      if (exp->used <= uVar2) {
        return 0;
      }
      plVar5 = exp->tokens;
      if (plVar5[uVar2] != LYXP_TOKEN_OPERATOR_PATH) {
        return 0;
      }
      uVar2 = uVar2 + 1;
      *exp_idx = uVar2;
    } while (exp->used != uVar2);
  }
LAB_00167e6c:
  ly_vlog(LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
  return -1;
}

Assistant:

static int
reparse_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    goto step;
    do {
        /* '/' or '//' */
        ++(*exp_idx);

        if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
            return -1;
        }
step:
        /* Step */
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            ++(*exp_idx);

            if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
                return -1;
            }
            if ((exp->tokens[*exp_idx] != LYXP_TOKEN_NAMETEST) && (exp->tokens[*exp_idx] != LYXP_TOKEN_NODETYPE)) {
                LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                       print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
                return -1;
            }
            /* fall through */
        case LYXP_TOKEN_NAMETEST:
            ++(*exp_idx);
            goto reparse_predicate;
            break;

        case LYXP_TOKEN_NODETYPE:
            ++(*exp_idx);

            /* '(' */
            if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_PAR1, 1)) {
                return -1;
            }
            ++(*exp_idx);

            /* ')' */
            if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
                return -1;
            }
            ++(*exp_idx);

reparse_predicate:
            /* Predicate* */
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                if (reparse_predicate(exp, exp_idx)) {
                    return -1;
                }
            }
            break;
        default:
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}